

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetLocationForBuild(cmGeneratorTarget *this)

{
  cmTarget *this_00;
  cmMakefile *this_01;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string macdir;
  string local_38;
  
  if (GetLocationForBuild()::location_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetLocationForBuild()::location_abi_cxx11_);
    if (iVar2 != 0) {
      GetLocationForBuild()::location_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetLocationForBuild()::location_abi_cxx11_.field_2;
      GetLocationForBuild()::location_abi_cxx11_._M_string_length = 0;
      GetLocationForBuild()::location_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&GetLocationForBuild()::location_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetLocationForBuild()::location_abi_cxx11_);
    }
  }
  this_00 = this->Target;
  if (this_00->IsImportedTarget == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)&local_38);
    cmTarget::ImportedGetFullPath(&macdir,this_00,&local_78,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&macdir);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)&local_38);
    GetDirectory(&macdir,this,&local_78,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&macdir);
    std::__cxx11::string::~string((string *)&macdir);
    std::__cxx11::string::~string((string *)&local_78);
    this_01 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&macdir,"CMAKE_CFG_INTDIR",(allocator<char> *)&local_78);
    pcVar3 = cmMakefile::GetDefinition(this_01,&macdir);
    std::__cxx11::string::~string((string *)&macdir);
    if ((pcVar3 != (char *)0x0) && ((*pcVar3 != '.' || (pcVar3[1] != '\0')))) {
      std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
      std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
    }
    bVar1 = IsAppBundleOnApple(this);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_7a);
      BuildBundleDirectory(&macdir,this,&local_78,&local_38,FullLevel);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_78);
      if (macdir._M_string_length != 0) {
        std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
        std::__cxx11::string::append((string *)&GetLocationForBuild()::location_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&macdir);
    }
    std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)&local_38);
    GetFullName(&macdir,this,&local_78,RuntimeBinaryArtifact);
    std::__cxx11::string::append((string *)&GetLocationForBuild()::location_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&macdir);
  std::__cxx11::string::~string((string *)&local_78);
  return GetLocationForBuild()::location_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetLocationForBuild() const
{
  static std::string location;
  if (this->IsImported()) {
    location = this->Target->ImportedGetFullPath(
      "", cmStateEnums::RuntimeBinaryArtifact);
    return location.c_str();
  }

  // Now handle the deprecated build-time configuration location.
  location = this->GetDirectory();
  const char* cfgid = this->Makefile->GetDefinition("CMAKE_CFG_INTDIR");
  if (cfgid && strcmp(cfgid, ".") != 0) {
    location += "/";
    location += cfgid;
  }

  if (this->IsAppBundleOnApple()) {
    std::string macdir = this->BuildBundleDirectory("", "", FullLevel);
    if (!macdir.empty()) {
      location += "/";
      location += macdir;
    }
  }
  location += "/";
  location += this->GetFullName("", cmStateEnums::RuntimeBinaryArtifact);
  return location.c_str();
}